

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

size_t __thiscall SimpleString::getPrintableSize(SimpleString *this)

{
  char ch;
  bool bVar1;
  size_t sVar2;
  long *in_RDI;
  char c;
  size_t i;
  size_t printable_str_size;
  size_t str_size;
  undefined8 local_20;
  undefined8 local_18;
  
  sVar2 = size((SimpleString *)0x111a28);
  local_18 = sVar2;
  for (local_20 = 0; local_20 < sVar2; local_20 = local_20 + 1) {
    ch = *(char *)(*in_RDI + local_20);
    bVar1 = isControlWithShortEscapeSequence(ch);
    if (bVar1) {
      local_18 = local_18 + 1;
    }
    else {
      bVar1 = isControl(ch);
      if (bVar1) {
        local_18 = local_18 + 3;
      }
    }
  }
  return local_18;
}

Assistant:

size_t SimpleString::getPrintableSize() const
{
    size_t str_size = size();
    size_t printable_str_size = str_size;

    for (size_t i = 0; i < str_size; i++)
    {
        char c = buffer_[i];
        if (isControlWithShortEscapeSequence(c))
        {
            printable_str_size += 1;
        }
        else if (isControl(c))
        {
            printable_str_size += 3;
        }
    }

    return printable_str_size;
}